

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O3

type dlib::assign_pixel_helpers::assign<dlib::rgb_pixel,dlib::hsi_pixel>
               (rgb_pixel *dest,hsi_pixel *src)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  dVar4 = ((double)src->h / 255.0) * 360.0;
  dVar2 = (double)src->s / 255.0;
  dVar3 = (double)src->i / 255.0;
  if (120.0 <= dVar4) {
    if (240.0 <= dVar4) {
      auVar7._0_8_ = (dVar4 + -240.0) / 60.0;
      dVar5 = (360.0 - dVar4) / 60.0;
      auVar7._8_8_ = 0;
    }
    else {
      dVar5 = (dVar4 + -120.0) / 60.0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (240.0 - dVar4) / 60.0;
      auVar7 = auVar1 << 0x40;
    }
  }
  else {
    auVar6._0_8_ = 120.0 - dVar4;
    auVar6._8_8_ = dVar4;
    auVar7 = divpd(auVar6,_DAT_002c7dc0);
    dVar5 = 0.0;
  }
  auVar7 = minpd(_DAT_002c7d50,auVar7);
  dVar4 = 1.0;
  if (dVar5 <= 1.0) {
    dVar4 = dVar5;
  }
  dVar5 = 1.0 - dVar2;
  dVar2 = dVar2 + dVar2;
  dVar4 = dVar2 * dVar4 + dVar5;
  dVar8 = dVar5 + dVar2 * auVar7._0_8_;
  dVar5 = dVar5 + dVar2 * auVar7._8_8_;
  if (0.5 <= dVar3) {
    dVar2 = 1.0 - dVar3;
    dVar3 = dVar3 + dVar3;
    dVar8 = dVar2 * dVar8 + dVar3 + -1.0;
    dVar5 = dVar2 * dVar5 + dVar3 + -1.0;
    dVar4 = dVar2 * dVar4 + dVar3 + -1.0;
  }
  else {
    dVar8 = dVar3 * dVar8;
    dVar5 = dVar3 * dVar5;
    dVar4 = dVar4 * dVar3;
  }
  dest->red = (uchar)(int)(dVar8 * 255.0 + 0.5);
  dest->green = (uchar)(int)(dVar5 * 255.0 + 0.5);
  dest->blue = (uchar)(int)(dVar4 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::rgb && pixel_traits<P2>::hsi>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c;
            HSL h;
            h.h = src.h;
            h.h = h.h/255.0*360;
            h.s = src.s/255.0;
            h.l = src.i/255.0;
            c = HSL2RGB(h);

            dest.red = static_cast<unsigned char>(c.r*255.0 + 0.5);
            dest.green = static_cast<unsigned char>(c.g*255.0 + 0.5);
            dest.blue = static_cast<unsigned char>(c.b*255.0 + 0.5);
        }